

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O1

Index __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::SampleSuccessorState
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,Index sI,Index jaI)

{
  Index IVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Y;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A;
  vector<unsigned_int,_std::allocator<unsigned_int>_> X;
  void *local_58;
  undefined8 uStack_50;
  long local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  void *local_28 [2];
  long local_18;
  
  if ((this->_m_cached_FlatTM == true) && (this->_m_eventObservability == true)) {
    IVar1 = TransitionModelDiscrete::SampleSuccessorState(this->_m_p_tModel,sI,jaI);
    return IVar1;
  }
  (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xd8))(local_28,this);
  __x = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
        (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x140))(this,jaI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_40,__x);
  local_58 = (void *)0x0;
  uStack_50 = 0;
  local_48 = 0;
  (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x210))(this,local_28,&local_40);
  IVar1 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xe8))(this,&local_58);
  if (local_58 != (void *)0x0) {
    operator_delete(local_58,local_48 - (long)local_58);
  }
  if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_28[0] != (void *)0x0) {
    operator_delete(local_28[0],local_18 - (long)local_28[0]);
  }
  return IVar1;
}

Assistant:

Index MultiAgentDecisionProcessDiscreteFactoredStates::
SampleSuccessorState (Index sI, Index jaI) const
{
    if(_m_cached_FlatTM && _m_eventObservability)
        return _m_p_tModel->SampleSuccessorState(sI, jaI);

    vector<Index> X = StateIndexToFactorValueIndices(sI);
    vector<Index> A = JointToIndividualActionIndices(jaI);
    vector<Index> Y;
    SampleSuccessorState(X,A,Y);
    return( FactorValueIndicesToStateIndex(Y) );
}